

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

double Catch::Benchmark::Detail::
       mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  difference_type dVar1;
  double dVar2;
  double sum;
  difference_type count;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first_local;
  
  count = (difference_type)last._M_current;
  last_local = first;
  dVar1 = __gnu_cxx::operator-
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     &count,&last_local);
  dVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    (last_local,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     count,0.0);
  return dVar2 / (double)dVar1;
}

Assistant:

double mean(Iterator first, Iterator last) {
                auto count = last - first;
                double sum = std::accumulate(first, last, 0.);
                return sum / count;
            }